

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum_core.cpp
# Opt level: O0

void mbedtls_mpi_core_bigendian_to_host(mbedtls_mpi_uint *A,size_t A_limbs)

{
  mbedtls_mpi_uint mVar1;
  mbedtls_mpi_uint mVar2;
  long in_RSI;
  mbedtls_mpi_uint *in_RDI;
  mbedtls_mpi_uint tmp;
  mbedtls_mpi_uint *cur_limb_right;
  mbedtls_mpi_uint *cur_limb_left;
  mbedtls_mpi_uint *local_20;
  mbedtls_mpi_uint *local_18;
  
  if (in_RSI != 0) {
    local_20 = in_RDI + in_RSI + -1;
    for (local_18 = in_RDI; local_18 <= local_20; local_18 = local_18 + 1) {
      mVar1 = mpi_bigendian_to_host(*local_18);
      mVar2 = mpi_bigendian_to_host(*local_20);
      *local_18 = mVar2;
      *local_20 = mVar1;
      local_20 = local_20 + -1;
    }
  }
  return;
}

Assistant:

void mbedtls_mpi_core_bigendian_to_host(mbedtls_mpi_uint *A,
                                        size_t A_limbs)
{
    mbedtls_mpi_uint *cur_limb_left;
    mbedtls_mpi_uint *cur_limb_right;
    if (A_limbs == 0) {
        return;
    }

    /*
     * Traverse limbs and
     * - adapt byte-order in each limb
     * - swap the limbs themselves.
     * For that, simultaneously traverse the limbs from left to right
     * and from right to left, as long as the left index is not bigger
     * than the right index (it's not a problem if limbs is odd and the
     * indices coincide in the last iteration).
     */
    for (cur_limb_left = A, cur_limb_right = A + (A_limbs - 1);
         cur_limb_left <= cur_limb_right;
         cur_limb_left++, cur_limb_right--) {
        mbedtls_mpi_uint tmp;
        /* Note that if cur_limb_left == cur_limb_right,
         * this code effectively swaps the bytes only once. */
        tmp             = mpi_bigendian_to_host(*cur_limb_left);
        *cur_limb_left  = mpi_bigendian_to_host(*cur_limb_right);
        *cur_limb_right = tmp;
    }
}